

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verilogAST.cpp
# Opt level: O2

string * __thiscall
verilogAST::Declaration::toString_abi_cxx11_(string *__return_storage_ptr__,Declaration *this)

{
  anon_class_1_0_00000001 local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,&this->decl," ");
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/src/verilogAST.cpp:10:7)_&&,_std::variant<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>_&>
    ::_S_vtable._M_arr
    [*(__index_type *)
      ((long)&(this->value).
              super__Variant_base<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Index,_std::default_delete<verilogAST::Index>_>,_std::unique_ptr<verilogAST::Slice,_std::default_delete<verilogAST::Slice>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
              .
              super__Move_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Vector>_>
              .
              super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Vector>_>
              .
              super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Vector>_>
              .
              super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Vector>_>
              .
              super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Index>,_std::unique_ptr<verilogAST::Slice>,_std::unique_ptr<verilogAST::Vector>_>
      + 8)]._M_data)(&local_70,&local_71,&this->value);
  std::operator+(&local_30,&local_50,&local_70);
  std::operator+(__return_storage_ptr__,&local_30,";");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Declaration::toString() {
  return decl + " " + variant_to_string(value) + ";";
}